

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

void * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,size_type userSize)

{
  SmallMemChunk *chunk;
  bool bVar1;
  SmallMemChunk *pSVar2;
  SmallMemChunk *pSVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  size_type chunkSize;
  undefined4 extraout_var;
  ulong uVar8;
  undefined4 extraout_var_00;
  MemChunk *pMVar9;
  ulong uVar10;
  undefined4 *puVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  void *unaff_R15;
  long lVar7;
  
  uVar13 = this->m_padding + userSize;
  cVar4 = (char)userSize;
  if (0xe0 < uVar13) {
    if (0xffffffffffffff7f < uVar13) {
      return (void *)0x0;
    }
    uVar10 = uVar13 + 0x1f & 0xfffffffffffffff0;
    goto LAB_001026a8;
  }
  uVar10 = 0x20;
  if (0xf < uVar13) {
    uVar10 = (ulong)((int)uVar13 + 0x1fU & 0x1f0);
  }
  bVar12 = (byte)(uVar10 >> 3);
  uVar14 = this->m_smallMap >> (bVar12 & 0x1f);
  if ((uVar14 & 3) == 0) {
    if (this->m_smallMap >> (bVar12 & 0x1f) != 0) {
      uVar6 = 2 << (bVar12 & 0x1f);
      uVar6 = (-uVar6 | uVar6) & uVar14 << (bVar12 & 0x1f);
      uVar14 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      iVar5 = CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
              ::remove(this->m_smallLists + uVar14,(char *)userSize);
      lVar7 = CONCAT44(extraout_var_00,iVar5);
      if (this->m_smallLists[uVar14].m_head == (SmallMemChunk *)0x0) {
        bVar12 = (byte)uVar14 & 0x1f;
        this->m_smallMap = this->m_smallMap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
      }
      if ((lVar7 == 0) ||
         (uVar13 = *(ulong *)(lVar7 + 8) & 0xfffffffffffffff0, uVar13 != uVar14 << 3))
      goto LAB_00102793;
      uVar8 = uVar13 - uVar10;
      if (0x1f < uVar8) {
        chunk = (SmallMemChunk *)(lVar7 + uVar10);
        *(ulong *)(lVar7 + 8) = uVar10;
        *(ulong *)(lVar7 + uVar10) = uVar10;
        *(ulong *)(lVar7 + 8 + uVar10) = uVar8;
        *(ulong *)(lVar7 + uVar13) = uVar8;
        if (uVar8 < 0x100) {
          pSVar2 = *(SmallMemChunk **)((long)this + uVar8 + 0x30);
          uVar8 = uVar8 >> 3;
          if (pSVar2 == (SmallMemChunk *)0x0) {
            chunk->next = chunk;
            chunk->prev = chunk;
            this->m_smallLists[uVar8].m_head = chunk;
          }
          else {
            pSVar3 = pSVar2->next;
            pSVar2->next = chunk;
            pSVar3->prev = chunk;
            chunk->next = pSVar3;
            chunk->prev = pSVar2;
          }
          if ((this->m_smallMap >> ((uint)uVar8 & 0x1f) & 1) == 0) {
            this->m_smallMap = this->m_smallMap | 1 << ((byte)uVar8 & 0x1f);
          }
        }
        else {
          addLargeChunk(this,(MemChunk *)chunk);
        }
      }
      bVar1 = this->m_storingExactSize;
      uVar13 = *(ulong *)(lVar7 + 8);
      uVar8 = uVar13 & 0xfffffffffffffff0;
      *(ulong *)(lVar7 + 8) = uVar13 | 1;
      if ((bVar1 == true) && (uVar8 != userSize + 0x10)) {
        *(ulong *)(lVar7 + 8) = uVar13 | 3;
        *(byte *)(lVar7 + -1 + uVar8) = ((byte)uVar13 & 0xf0) - (char)(userSize + 0x10);
      }
      *(ulong *)(lVar7 + uVar8) = uVar8 | 1;
      if ((this->m_padding == true) &&
         (bVar12 = (((byte)*(undefined4 *)(lVar7 + 8) & 0xf0) - cVar4) - 0x11, '\0' < (char)bVar12))
      {
        uVar14 = 8;
        if ((char)bVar12 < '\b') {
          uVar14 = (uint)bVar12;
        }
        uVar13 = 1;
        if ('\x01' < (char)uVar14) {
          uVar13 = (ulong)uVar14;
        }
        uVar8 = 0;
        do {
          *(char *)(lVar7 + userSize + 0x10 + uVar8) = this->m_paddingByte;
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
      goto LAB_0010269a;
    }
    bVar1 = true;
  }
  else {
    uVar14 = (uVar14 & 1 | (uint)(uVar10 >> 3)) ^ 1;
    iVar5 = CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
            ::remove(this->m_smallLists + uVar14,(char *)userSize);
    lVar7 = CONCAT44(extraout_var,iVar5);
    if (this->m_smallLists[uVar14].m_head == (SmallMemChunk *)0x0) {
      bVar12 = (byte)uVar14 & 0x1f;
      this->m_smallMap = this->m_smallMap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
    }
    if (lVar7 == 0) {
LAB_00102793:
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x10);
      *puVar11 = 1;
      *(char **)(puVar11 + 2) = "assertion failure.";
      __cxa_throw(puVar11,&Exception::typeinfo,0);
    }
    uVar13 = *(ulong *)(lVar7 + 8);
    uVar8 = uVar13 & 0xfffffffffffffff0;
    if (uVar8 != uVar14 << 3) goto LAB_00102793;
    bVar1 = this->m_storingExactSize;
    *(ulong *)(lVar7 + 8) = uVar13 | 1;
    if ((bVar1 == true) && (uVar8 != userSize + 0x10)) {
      *(ulong *)(lVar7 + 8) = uVar13 | 3;
      *(byte *)(lVar7 + -1 + uVar8) = ((byte)uVar13 & 0xf0) - (char)(userSize + 0x10);
    }
    *(ulong *)(lVar7 + uVar8) = uVar8 | 1;
    if ((this->m_padding == true) &&
       (bVar12 = (((byte)*(undefined4 *)(lVar7 + 8) & 0xf0) - cVar4) - 0x11, '\0' < (char)bVar12)) {
      uVar14 = 8;
      if ((char)bVar12 < '\b') {
        uVar14 = (uint)bVar12;
      }
      uVar13 = 1;
      if ('\x01' < (char)uVar14) {
        uVar13 = (ulong)uVar14;
      }
      uVar8 = 0;
      do {
        *(char *)(lVar7 + userSize + 0x10 + uVar8) = this->m_paddingByte;
        uVar8 = uVar8 + 1;
      } while (uVar13 != uVar8);
    }
LAB_0010269a:
    unaff_R15 = (void *)(lVar7 + 0x10);
    bVar1 = false;
  }
  if (!bVar1) {
    return unaff_R15;
  }
LAB_001026a8:
  if (this->m_treeMap == 0) {
    pMVar9 = (MemChunk *)0x0;
  }
  else {
    pMVar9 = treeMalloc(this,uVar10);
  }
  if ((pMVar9 == (MemChunk *)0x0) && (pMVar9 = arenaAlloc(this,uVar10), pMVar9 == (MemChunk *)0x0))
  {
    return (void *)0x0;
  }
  bVar1 = this->m_storingExactSize;
  uVar13 = pMVar9->m_size;
  uVar10 = uVar13 & 0xfffffffffffffff0;
  pMVar9->m_size = uVar13 | 1;
  if ((bVar1 == true) && (uVar10 != userSize + 0x10)) {
    pMVar9->m_size = uVar13 | 3;
    *(byte *)((long)pMVar9 + (uVar10 - 1)) = ((byte)uVar13 & 0xf0) - (char)(userSize + 0x10);
  }
  *(ulong *)((long)&pMVar9->m_prevFootSize + uVar10) = uVar10 | 1;
  if ((this->m_padding == true) &&
     (bVar12 = (((byte)(int)pMVar9->m_size & 0xf0) - cVar4) - 0x11, '\0' < (char)bVar12)) {
    uVar14 = 8;
    if ((char)bVar12 < '\b') {
      uVar14 = (uint)bVar12;
    }
    uVar13 = 1;
    if ('\x01' < (char)uVar14) {
      uVar13 = (ulong)uVar14;
    }
    uVar10 = 0;
    do {
      *(char *)((long)&pMVar9[1].m_prevFootSize + uVar10 + userSize) = this->m_paddingByte;
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  return pMVar9 + 1;
}

Assistant:

T*
    allocate (size_type userSize)
    {
        size_type  chunkSize;

        size_type allocSize = getMinAllocSize (userSize);

        if (allocSize < MIN_LARGE_REQUEST)
        {
            BinIndexType binIndex;
            BinIndexType smallBits;
            chunkSize = (allocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize (allocSize);
            binIndex = getSmallBinIndex (chunkSize);
            smallBits = m_smallMap >> binIndex;

            /*
             * Check if two smallest chunk lists that can satisfy the request.
             * Note that since the chunk is quite tight, it is not necessary
             * to split the chunk since there will not be enough rooms.
             */
            if ((smallBits & 0x3U) != 0)
            {
                MemChunk* chunk;
                binIndex += ~smallBits & 1; /* Uses next bin if idx empty */

                chunk = removeSmallChunkList (binIndex);
                COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize (binIndex));

                setUsed (chunk, userSize);

                return getUserPointer (chunk, userSize);
            }
            else
            {
                if (smallBits != 0)
                {
                    /* Use chunk in next nonempty smallbin */
                    MemChunk* chunk;
                    BinIndexType i;
                    BinIndexType leftbits = (smallBits << binIndex) & left_bits(idx2bit(binIndex));
                    BinIndexType leastbit = least_bit(leftbits);
                    cookmem_bit2treeIndex(leastbit, i);

                    chunk = removeSmallChunkList(i);
                    COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize(i));

                    chunk = splitChunk (chunk, chunkSize);

                    setUsed (chunk, userSize);

                    return getUserPointer (chunk, userSize);
                }
            }
        }
        else if (allocSize >= MAX_REQUEST)
        {
            // The request size is too big.
            m_logger.logAllocation (nullptr, userSize);
            return nullptr;
        }
        else
        {
            chunkSize = calcChunkSize (allocSize);
        }

        MemChunk* chunk;

        /*
         * Check if we have enough space in existing chunks.
         */
        if (m_treeMap != 0)
        {
            chunk = treeMalloc (chunkSize);
        }
        else
        {
            chunk = nullptr;
        }

        /*
         * At this point, we have to allocate memory from arena.
         */
        if (chunk == nullptr)
        {
            chunk = arenaAlloc (chunkSize);

            if (chunk == nullptr)
            {
                m_logger.logAllocation (nullptr, userSize);
                return nullptr;
            }
        }

        setUsed (chunk, userSize);

        return getUserPointer (chunk, userSize);
    }